

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void __thiscall pegmatite::Context::Context(Context *this,Input *i,Rule *ws,ParserDelegate *d)

{
  int iVar1;
  undefined4 extraout_var;
  
  this->whitespace_rule = ws;
  ParserPosition::ParserPosition(&this->position,i);
  ParserPosition::ParserPosition(&this->error_pos,i);
  (this->start).buffer = i;
  (this->start).idx = 0;
  iVar1 = (*i->_vptr_Input[1])(i);
  (this->finish).buffer = i;
  (this->finish).idx = CONCAT44(extraout_var,iVar1);
  (this->matches).
  super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->matches).
  super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->matches).
           super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->matches).
           super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  this->delegate = d;
  (this->rule_states)._M_h._M_buckets = &(this->rule_states)._M_h._M_single_bucket;
  (this->rule_states)._M_h._M_bucket_count = 1;
  (this->rule_states)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->rule_states)._M_h._M_element_count = 0;
  (this->rule_states)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->rule_states)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->rule_states)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->cache)._M_h._M_buckets = &(this->cache)._M_h._M_single_bucket;
  (this->cache)._M_h._M_bucket_count = 1;
  (this->cache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->cache)._M_h._M_element_count = 0;
  (this->cache)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->cache)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->cache)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

Context(Input &i, const Rule &ws, const ParserDelegate &d) :
		whitespace_rule(ws),
		position(i),
		error_pos(i),
		start(i.begin()),
		finish(i.end()),
		delegate(d)
	{
	}